

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dim.cc
# Opt level: O2

ostream * cnn::operator<<(ostream *os,Dim *d)

{
  ostream *poVar1;
  uint i;
  ulong uVar2;
  
  std::operator<<(os,'{');
  for (uVar2 = 0; uVar2 < d->nd; uVar2 = uVar2 + 1) {
    if (uVar2 != 0) {
      std::operator<<(os,',');
    }
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  if (d->bd != 1) {
    poVar1 = std::operator<<(os,'X');
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  poVar1 = std::operator<<(os,'}');
  return poVar1;
}

Assistant:

ostream& operator<<(ostream& os, const Dim& d) {
  os << '{';
  for (unsigned i = 0; i < d.nd; ++i) {
    if (i) os << ',';
    os << d.d[i];
  }
  if(d.bd != 1) os << 'X' << d.bd;
  return os << '}';
}